

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O2

UniValue * __thiscall
CRPCTable::dumpArgMap(UniValue *__return_storage_ptr__,CRPCTable *this,JSONRPCRequest *args_request)

{
  long lVar1;
  pointer pUVar2;
  string str;
  UniValue val;
  bool bVar3;
  vector<UniValue,_std::allocator<UniValue>_> *pvVar4;
  _Base_ptr p_Var5;
  pointer pUVar6;
  long in_FS_OFFSET;
  _Alloc_hider in_stack_fffffffffffffd98;
  _Base_ptr p_Var7;
  undefined1 in_stack_fffffffffffffda0 [24];
  undefined1 in_stack_fffffffffffffdb8 [56];
  UniValue result;
  undefined1 *local_1b0;
  undefined8 local_1a8;
  undefined1 local_1a0 [16];
  JSONRPCRequest request;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  JSONRPCRequest::JSONRPCRequest(&request,args_request);
  request.mode = GET_ARGS;
  local_1b0 = local_1a0;
  local_1a8 = 0;
  local_1a0[0] = 0;
  str._M_string_length = in_stack_fffffffffffffda0._0_8_;
  str.field_2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 )in_stack_fffffffffffffda0._8_16_;
  str._M_dataplus._M_p = in_stack_fffffffffffffd98._M_p;
  UniValue::UniValue(__return_storage_ptr__,VARR,str);
  std::__cxx11::string::~string((string *)&local_1b0);
  p_Var7 = &(this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var5 = (this->mapCommands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var5 != p_Var7; p_Var5 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var5)) {
    result.val._M_string_length = 0;
    result.val.field_2._M_local_buf[0] = '\0';
    result.typ = VNULL;
    result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    result.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    result.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    result.keys.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    result.val._M_dataplus._M_p = (pointer)&result.val.field_2;
    bVar3 = ExecuteCommands((vector<const_CRPCCommand_*,_std::allocator<const_CRPCCommand_*>_> *)
                            (p_Var5 + 2),&request,&result);
    if (bVar3) {
      pvVar4 = UniValue::getValues(&result);
      pUVar2 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (pUVar6 = (pvVar4->super__Vector_base<UniValue,_std::allocator<UniValue>_>)._M_impl.
                    super__Vector_impl_data._M_start; pUVar6 != pUVar2; pUVar6 = pUVar6 + 1) {
        UniValue::UniValue((UniValue *)&stack0xfffffffffffffda0,pUVar6);
        val.val._0_24_ = in_stack_fffffffffffffda0;
        val._0_8_ = p_Var7;
        val._32_56_ = in_stack_fffffffffffffdb8;
        UniValue::push_back(__return_storage_ptr__,val);
        UniValue::~UniValue((UniValue *)&stack0xfffffffffffffda0);
      }
    }
    UniValue::~UniValue(&result);
  }
  JSONRPCRequest::~JSONRPCRequest(&request);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

UniValue CRPCTable::dumpArgMap(const JSONRPCRequest& args_request) const
{
    JSONRPCRequest request = args_request;
    request.mode = JSONRPCRequest::GET_ARGS;

    UniValue ret{UniValue::VARR};
    for (const auto& cmd : mapCommands) {
        UniValue result;
        if (ExecuteCommands(cmd.second, request, result)) {
            for (const auto& values : result.getValues()) {
                ret.push_back(values);
            }
        }
    }
    return ret;
}